

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iouring-pollhup.c
# Opt level: O3

void read_data2(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  ssize_t *psVar2;
  int64_t eval_b;
  int64_t eval_a;
  ssize_t local_8;
  
  local_8 = nread;
  if (nread < 0) {
    if (nread == -0xfff) {
      iVar1 = close(duped_fd);
      local_8 = (ssize_t)iVar1;
      if (local_8 == 0) {
        duped_fd = -1;
        uv_close(&p2,0);
        uv_close(&idle_handle,0);
        return;
      }
      goto LAB_001a6418;
    }
  }
  else {
    if (0 < nread) {
      return;
    }
    read_data2_cold_1();
  }
  read_data2_cold_2();
LAB_001a6418:
  psVar2 = &local_8;
  read_data2_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(psVar2,0);
  return;
}

Assistant:

static void read_data2(uv_stream_t* stream,
                       ssize_t nread,
                       const uv_buf_t* buf) {
  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);
    ASSERT_OK(close(duped_fd));
    duped_fd = -1;
    uv_close((uv_handle_t*) &p2, NULL);
    uv_close((uv_handle_t*) &idle_handle, NULL);
  } else {
    /* If nread == 0 is because of POLLHUP received still from pipefds[0] file
     * description which is still referenced in duped_fd. It should not happen
     * if close(p1) was called after EPOLL_CTL_DEL.
     */
    ASSERT_GT(nread, 0);
  }
}